

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimal2.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  char *pcVar6;
  reference pvVar7;
  array<char,_4UL> local_289;
  array<char,_4UL> local_285;
  allocator<riffcpp::Chunk> local_281;
  Chunk local_280;
  Chunk local_278;
  undefined1 local_270 [8];
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> chunks;
  undefined1 local_250 [8];
  vector<char,_std::allocator<char>_> buffer;
  Chunk local_228;
  Chunk ch;
  ifstream stream;
  char **argv_local;
  int argc_local;
  
  std::ifstream::ifstream(&ch,"minimal_2.riff",_S_bin);
  riffcpp::Chunk::Chunk(&local_228,"minimal_2.riff");
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_250)
  ;
  chunks.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = riffcpp::Chunk::id(&local_228);
  bVar1 = std::operator==((array<char,_4UL> *)
                          ((long)&chunks.
                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                          (array<char,_4UL> *)&riffcpp::riff_id);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,7);
    poVar3 = std::operator<<(poVar3,": ch.id() == riffcpp::riff_id\n");
    poVar3 = std::operator<<(poVar3,"Reason: ");
    poVar3 = std::operator<<(poVar3,"Toplevel \'RIFF\' id expected");
    std::operator<<(poVar3,'\n');
    exit(1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"ch.id() == riffcpp::riff_id (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,7);
  std::operator<<(poVar3,"): OK\n");
  chunks.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = riffcpp::Chunk::type(&local_228);
  bVar1 = std::operator==((array<char,_4UL> *)
                          &chunks.
                           super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,&smpl_id);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
    poVar3 = std::operator<<(poVar3,": ch.type() == smpl_id\n");
    poVar3 = std::operator<<(poVar3,"Reason: ");
    poVar3 = std::operator<<(poVar3,"Expected \'smpl\' chunk");
    std::operator<<(poVar3,'\n');
    exit(1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"ch.type() == smpl_id (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
  std::operator<<(poVar3,"): OK\n");
  riffcpp::Chunk::begin(&local_278,SUB81(&local_228,0));
  riffcpp::Chunk::end(&local_280);
  std::allocator<riffcpp::Chunk>::allocator(&local_281);
  std::vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>>::vector<riffcpp::Chunk::iterator,void>
            ((vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>> *)local_270,
             (iterator *)&local_278,(iterator *)&local_280,&local_281);
  std::allocator<riffcpp::Chunk>::~allocator(&local_281);
  riffcpp::Chunk::iterator::~iterator((iterator *)&local_280);
  riffcpp::Chunk::iterator::~iterator((iterator *)&local_278);
  sVar4 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::size
                    ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_270);
  if (sVar4 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,10);
    poVar3 = std::operator<<(poVar3,": chunks.size() == 2\n");
    poVar3 = std::operator<<(poVar3,"Reason: ");
    poVar3 = std::operator<<(poVar3,"Toplevel chunk must contain two subchunks");
    std::operator<<(poVar3,'\n');
    exit(1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"chunks.size() == 2 (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,10);
  std::operator<<(poVar3,"): OK\n");
  pvVar5 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_270,0);
  local_285._M_elems = (_Type)riffcpp::Chunk::id(pvVar5);
  bVar1 = std::operator==(&local_285,&tst1_id);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc);
    poVar3 = std::operator<<(poVar3,": chunks[0].id() == tst1_id\n");
    poVar3 = std::operator<<(poVar3,"Reason: ");
    poVar3 = std::operator<<(poVar3,"Subchunk must have \'tst1\' id");
    std::operator<<(poVar3,'\n');
    exit(1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"chunks[0].id() == tst1_id (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc);
  std::operator<<(poVar3,"): OK\n");
  pvVar5 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_270,0);
  uVar2 = riffcpp::Chunk::size(pvVar5);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)local_250,(ulong)uVar2);
  pvVar5 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_270,0);
  pcVar6 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_250);
  sVar4 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_250);
  riffcpp::Chunk::read_data(pvVar5,pcVar6,sVar4);
  sVar4 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_250);
  if (sVar4 != 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xf);
    poVar3 = std::operator<<(poVar3,": buffer.size() == 1\n");
    poVar3 = std::operator<<(poVar3,"Reason: ");
    poVar3 = std::operator<<(poVar3,"Subchunk must have data size 1");
    std::operator<<(poVar3,'\n');
    exit(1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"buffer.size() == 1 (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xf);
  std::operator<<(poVar3,"): OK\n");
  pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_250,0);
  if (*pvVar7 != -1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x10);
    poVar3 = std::operator<<(poVar3,": (unsigned char)buffer[0] == 0xFF\n");
    poVar3 = std::operator<<(poVar3,"Reason: ");
    poVar3 = std::operator<<(poVar3,"Subchunk must contain \'0xFF\'");
    std::operator<<(poVar3,'\n');
    exit(1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"(unsigned char)buffer[0] == 0xFF (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x10);
  std::operator<<(poVar3,"): OK\n");
  pvVar5 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_270,1);
  local_289._M_elems = (_Type)riffcpp::Chunk::id(pvVar5);
  bVar1 = std::operator==(&local_289,&tst2_id);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x12);
    poVar3 = std::operator<<(poVar3,": chunks[1].id() == tst2_id\n");
    poVar3 = std::operator<<(poVar3,"Reason: ");
    poVar3 = std::operator<<(poVar3,"Subchunk must have \'tst2\' id");
    std::operator<<(poVar3,'\n');
    exit(1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"chunks[1].id() == tst2_id (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x12);
  std::operator<<(poVar3,"): OK\n");
  pvVar5 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_270,1);
  uVar2 = riffcpp::Chunk::size(pvVar5);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)local_250,(ulong)uVar2);
  pvVar5 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_270,1);
  pcVar6 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_250);
  sVar4 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_250);
  riffcpp::Chunk::read_data(pvVar5,pcVar6,sVar4);
  sVar4 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_250);
  if (sVar4 != 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x15);
    poVar3 = std::operator<<(poVar3,": buffer.size() == 1\n");
    poVar3 = std::operator<<(poVar3,"Reason: ");
    poVar3 = std::operator<<(poVar3,"Subchunk must have data size 1");
    std::operator<<(poVar3,'\n');
    exit(1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"buffer.size() == 1 (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x15);
  std::operator<<(poVar3,"): OK\n");
  pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_250,0);
  if (*pvVar7 != -0x12) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x16);
    poVar3 = std::operator<<(poVar3,": (unsigned char)buffer[0] == 0xEE\n");
    poVar3 = std::operator<<(poVar3,"Reason: ");
    poVar3 = std::operator<<(poVar3,"Subchunk must contain \'0xFF\'");
    std::operator<<(poVar3,'\n');
    exit(1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"(unsigned char)buffer[0] == 0xEE (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x16);
  std::operator<<(poVar3,"): OK\n");
  std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::~vector
            ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_270);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_250);
  riffcpp::Chunk::~Chunk(&local_228);
  std::ifstream::~ifstream(&ch);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  std::ifstream stream("minimal_2.riff", std::ios::binary);
  riffcpp::Chunk ch("minimal_2.riff");
  std::vector<char> buffer;
  TEST_ASSERT(ch.id() == riffcpp::riff_id, "Toplevel 'RIFF' id expected");
  TEST_ASSERT(ch.type() == smpl_id, "Expected 'smpl' chunk");
  std::vector<riffcpp::Chunk> chunks(ch.begin(), ch.end());
  TEST_ASSERT(chunks.size() == 2, "Toplevel chunk must contain two subchunks");

  TEST_ASSERT(chunks[0].id() == tst1_id, "Subchunk must have 'tst1' id");
  buffer.resize(chunks[0].size());
  chunks[0].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(buffer.size() == 1, "Subchunk must have data size 1");
  TEST_ASSERT((unsigned char)buffer[0] == 0xFF, "Subchunk must contain '0xFF'");

  TEST_ASSERT(chunks[1].id() == tst2_id, "Subchunk must have 'tst2' id");
  buffer.resize(chunks[1].size());
  chunks[1].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(buffer.size() == 1, "Subchunk must have data size 1");
  TEST_ASSERT((unsigned char)buffer[0] == 0xEE, "Subchunk must contain '0xFF'");
}